

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O2

MacroProps *
icu_63::number::impl::NumberPropertyMapper::oldToNew
          (MacroProps *__return_storage_ptr__,DecimalFormatProperties *properties,
          DecimalFormatSymbols *symbols,DecimalFormatWarehouse *warehouse,
          DecimalFormatProperties *exportedProperties,UErrorCode *status)

{
  uint uVar1;
  uint uVar2;
  CurrencyPluralInfo *pCVar3;
  FractionSignificantSettings FVar4;
  FractionSignificantSettings FVar5;
  MacroProps *pMVar6;
  int iVar7;
  RoundingMode roundingMode;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  PluralRules *pPVar12;
  double dVar13;
  uint uVar14;
  UErrorCode *extraout_RDX;
  UErrorCode *extraout_RDX_00;
  UErrorCode *pUVar15;
  UCurrencyUsage UVar16;
  DecimalFormatWarehouse *pDVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  Grouper GVar24;
  Padder PVar25;
  IntegerWidth IVar26;
  Notation NVar27;
  char local_2b9;
  uint local_2b0;
  anon_union_8_2_136a0349_for_fUnion local_2a8;
  UCurrencyUsage UStack_2a0;
  undefined4 uStack_29c;
  short local_298;
  undefined2 uStack_296;
  undefined8 uStack_294;
  double local_288;
  UCurrencyUsage local_27c;
  UErrorCode *local_278;
  MacroProps *local_270;
  ulong local_268;
  CurrencyUnit currency;
  Precision local_238;
  CurrencyUnit local_218;
  Precision precision;
  Locale locale;
  
  local_278 = status;
  MacroProps::MacroProps(__return_storage_ptr__);
  local_270 = __return_storage_ptr__;
  Locale::Locale(&locale,&symbols->locale);
  SymbolsWrapper::setTo(&__return_storage_ptr__->symbols,symbols);
  pCVar3 = (properties->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.
           ptr;
  pUVar15 = extraout_RDX;
  if (pCVar3 == (CurrencyPluralInfo *)0x0) {
LAB_0025255b:
    (warehouse->currencyPluralInfoAPP).fBogus = true;
    PropertiesAffixPatternProvider::setTo(&warehouse->propertiesAPP,properties,pUVar15);
    pDVar17 = warehouse;
  }
  else {
    pPVar12 = CurrencyPluralInfo::getPluralRules(pCVar3);
    __return_storage_ptr__->rules = pPVar12;
    pCVar3 = (properties->currencyPluralInfo).fPtr.
             super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr;
    pUVar15 = extraout_RDX_00;
    if (pCVar3 == (CurrencyPluralInfo *)0x0) goto LAB_0025255b;
    CurrencyPluralInfoAffixProvider::setTo
              (&warehouse->currencyPluralInfoAPP,pCVar3,properties,local_278);
    (warehouse->propertiesAPP).fBogus = true;
    pDVar17 = (DecimalFormatWarehouse *)&warehouse->currencyPluralInfoAPP;
  }
  __return_storage_ptr__->affixProvider = (AffixPatternProvider *)pDVar17;
  local_2b9 = '\x01';
  if ((((properties->currency).fNull == true) &&
      ((properties->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr
       == (CurrencyPluralInfo *)0x0)) && ((properties->currencyUsage).fNull == true)) {
    iVar7 = (*(pDVar17->propertiesAPP).super_AffixPatternProvider._vptr_AffixPatternProvider[5])
                      (pDVar17);
    local_2b9 = (char)iVar7;
  }
  resolveCurrency(&currency,properties,&locale,local_278);
  UVar16 = UCURR_USAGE_STANDARD;
  if ((properties->currencyUsage).fNull == false) {
    UVar16 = (properties->currencyUsage).fValue;
  }
  if (local_2b9 != '\0') {
    MeasureUnit::operator=(&__return_storage_ptr__->unit,&currency.super_MeasureUnit);
  }
  CurrencyUnit::CurrencyUnit(&local_218,&currency);
  CurrencySymbols::CurrencySymbols
            ((CurrencySymbols *)&precision,&local_218,&locale,symbols,local_278);
  local_27c = UVar16;
  CurrencySymbols::operator=(&warehouse->currencySymbols,(CurrencySymbols *)&precision);
  CurrencySymbols::~CurrencySymbols((CurrencySymbols *)&precision);
  CurrencyUnit::~CurrencyUnit(&local_218);
  __return_storage_ptr__->currencySymbols = &warehouse->currencySymbols;
  uVar11 = properties->maximumFractionDigits;
  uVar10 = properties->minimumFractionDigits;
  uVar1 = properties->minimumSignificantDigits;
  local_268 = (ulong)uVar1;
  uVar2 = properties->maximumSignificantDigits;
  if ((properties->roundingMode).fNull == false) {
    roundingMode = (properties->roundingMode).fValue;
  }
  else {
    roundingMode = UNUM_FOUND_HALFEVEN;
  }
  uVar21 = properties->maximumIntegerDigits;
  uVar20 = properties->minimumIntegerDigits;
  dVar13 = properties->roundingIncrement;
  uVar22 = SUB84(dVar13,0);
  uVar23 = (undefined4)((ulong)dVar13 >> 0x20);
  uVar9 = uVar10;
  uVar14 = uVar11;
  if ((local_2b9 != '\0') && (uVar11 == 0xffffffff || uVar10 == 0xffffffff)) {
    local_288 = dVar13;
    uVar8 = ucurr_getDefaultFractionDigitsForUsage_63
                      ((UChar *)&currency.super_MeasureUnit.field_0x14,local_27c,local_278);
    uVar22 = SUB84(local_288,0);
    uVar23 = (undefined4)((ulong)local_288 >> 0x20);
    uVar9 = uVar8;
    uVar14 = uVar8;
    if ((uVar10 & uVar11) != 0xffffffff) {
      if (uVar10 == 0xffffffff) {
        uVar14 = uVar11;
        if ((int)uVar11 <= (int)uVar8) {
          uVar9 = uVar11;
        }
      }
      else {
        uVar9 = uVar10;
        if ((int)uVar8 < (int)uVar10) {
          uVar14 = uVar10;
        }
      }
    }
  }
  pMVar6 = local_270;
  if ((uVar20 == 0) && (uVar14 != 0)) {
    if ((int)uVar9 < 2) {
      uVar9 = 1;
    }
    local_2b0 = uVar9;
    if ((int)uVar9 < (int)uVar14) {
      local_2b0 = uVar14;
    }
    uVar20 = 0xffffffff;
    if ((int)uVar14 < 0) {
      local_2b0 = uVar20;
    }
    uVar14 = uVar21;
    if (999 < (int)uVar21) {
      uVar14 = uVar20;
    }
    if ((int)uVar21 < 0) {
      uVar14 = uVar20;
    }
    uVar20 = 0;
    local_288 = (double)CONCAT44(local_288._4_4_,uVar9);
  }
  else {
    uVar8 = 0xffffffff;
    local_2b0 = 0;
    if (0 < (int)uVar9) {
      local_2b0 = uVar9;
    }
    local_288 = (double)CONCAT44(local_288._4_4_,local_2b0);
    if ((int)local_2b0 < (int)uVar14) {
      local_2b0 = uVar14;
    }
    if ((int)uVar14 < 0) {
      local_2b0 = uVar8;
    }
    if (uVar20 - 1000 < 0xfffffc19) {
      uVar20 = 1;
    }
    uVar14 = uVar8;
    if (((-1 < (int)uVar21) && (uVar14 = uVar20, (int)uVar20 <= (int)uVar21)) &&
       (uVar14 = uVar8, uVar21 < 1000)) {
      uVar14 = uVar21;
    }
  }
  precision._0_8_ = (ulong)(uint)precision._4_4_ << 0x20;
  uVar21 = (uint)local_268;
  if ((properties->currencyUsage).fNull == false) {
    Precision::constructCurrency(local_27c);
    CurrencyPrecision::withCurrency
              ((Precision *)&local_2a8.minMaxInt,(CurrencyPrecision *)&local_238,&currency);
  }
  else {
    if (((double)CONCAT44(uVar23,uVar22) == 0.0) && (!NAN((double)CONCAT44(uVar23,uVar22)))) {
      if ((uVar1 & uVar2) == 0xffffffff) {
        if ((uVar10 & uVar11) == 0xffffffff) {
          if (local_2b9 != '\0') {
            Precision::constructCurrency(local_27c);
            precision.fUnion.increment.fMinFrac = local_298;
            precision._20_8_ = uStack_294;
            precision._0_8_ = local_2a8;
            precision.fUnion.currencyUsage = UStack_2a0;
            precision.fUnion._4_4_ = uStack_29c;
          }
        }
        else {
          Precision::constructFraction(local_288._0_4_,local_2b0);
          precision.fUnion.increment.fMinFrac = local_298;
          precision._20_8_ = uStack_294;
          precision._0_8_ = local_2a8;
          precision.fUnion.currencyUsage = UStack_2a0;
          precision.fUnion._4_4_ = uStack_29c;
        }
        uVar21 = 0xffffffff;
        uVar11 = uVar21;
      }
      else {
        if (0x3e6 < (int)uVar21) {
          uVar21 = 999;
        }
        if ((int)uVar21 < 2) {
          uVar21 = 1;
        }
        uVar11 = 999;
        if (((-1 < (int)uVar2) && (uVar11 = uVar21, uVar21 <= uVar2)) && (uVar11 = 999, uVar2 < 999)
           ) {
          uVar11 = uVar2;
        }
        Precision::constructSignificant(uVar21,uVar11);
        precision._0_8_ = local_2a8;
        precision._20_8_ = uStack_294;
        precision.fUnion.increment.fMinFrac = local_298;
        precision.fUnion.currencyUsage = UStack_2a0;
        precision.fUnion._4_4_ = uStack_29c;
      }
      goto LAB_00252852;
    }
    Precision::constructIncrement
              ((IncrementPrecision *)&local_2a8.minMaxInt,(double)CONCAT44(uVar23,uVar22),
               local_288._0_4_);
  }
  precision.fUnion.increment.fMinFrac = local_298;
  precision._20_8_ = uStack_294;
  precision._0_8_ = local_2a8;
  precision.fUnion.currencyUsage = UStack_2a0;
  precision.fUnion._4_4_ = uStack_29c;
  uVar11 = uVar2;
LAB_00252852:
  if (precision.fType != RND_BOGUS) {
    Precision::withMode(&precision,roundingMode);
    precision.fUnion.increment.fMinFrac = local_298;
    precision._20_8_ = uStack_294;
    precision._0_8_ = local_2a8;
    precision.fUnion.currencyUsage = UStack_2a0;
    precision.fUnion._4_4_ = uStack_29c;
    *(ulong *)((long)&(pMVar6->precision).fUnion.increment.fIncrement + 4) =
         CONCAT26(uStack_296,CONCAT24(local_298,uStack_29c));
    *(undefined8 *)((long)&(pMVar6->precision).fUnion + 0xc) = uStack_294;
    FVar5.fMinSig = (undefined2)uStack_29c;
    FVar5.fMaxSig = uStack_29c._2_2_;
    FVar5.fMinFrac = (undefined2)UStack_2a0;
    FVar5.fMaxFrac = UStack_2a0._2_2_;
    *(anon_union_8_2_136a0349_for_fUnion *)&pMVar6->precision = local_2a8;
    (pMVar6->precision).fUnion.fracSig = FVar5;
  }
  IntegerWidth::IntegerWidth
            ((IntegerWidth *)&local_2a8.minMaxInt,(digits_t)uVar20,(digits_t)uVar14,
             properties->formatFailIfMoreThanMaxDigits);
  (pMVar6->integerWidth).fHasError = (bool)(undefined1)UStack_2a0;
  (pMVar6->integerWidth).fUnion = local_2a8;
  GVar24 = Grouper::forProperties(properties);
  pMVar6->grouper = GVar24;
  if (properties->formatWidth != -1) {
    PVar25 = Padder::forProperties(properties);
    pMVar6->padder = PVar25;
  }
  pMVar6->decimal = (uint)properties->decimalSeparatorAlwaysShown;
  pMVar6->sign = (uint)properties->signAlwaysShown;
  if (properties->minimumExponentDigits != -1) {
    if ((int)uVar14 < 9) {
      if ((1 < (int)uVar20) && ((int)uVar20 < (int)uVar14)) {
        uVar20 = 1;
        IVar26 = IntegerWidth::zeroFillTo(1);
        local_2a8 = IVar26.fUnion;
        UStack_2a0 = CONCAT31(UStack_2a0._1_3_,IVar26.fHasError);
        IVar26 = IntegerWidth::truncateAt((IntegerWidth *)&local_2a8.minMaxInt,uVar14);
        (pMVar6->integerWidth).fUnion = IVar26.fUnion;
        (pMVar6->integerWidth).fHasError = IVar26.fHasError;
      }
    }
    else {
      IVar26 = IntegerWidth::zeroFillTo(uVar20);
      local_2a8 = IVar26.fUnion;
      UStack_2a0 = CONCAT31(UStack_2a0._1_3_,IVar26.fHasError);
      IVar26 = IntegerWidth::truncateAt((IntegerWidth *)&local_2a8.minMaxInt,uVar20);
      (pMVar6->integerWidth).fUnion = IVar26.fUnion;
      (pMVar6->integerWidth).fHasError = IVar26.fHasError;
      uVar14 = uVar20;
    }
    uVar10 = 0xffffffff;
    if (-1 < (int)uVar14) {
      uVar10 = uVar14;
    }
    ScientificNotation::ScientificNotation
              ((ScientificNotation *)&local_2a8.minMaxInt,(int8_t)uVar10,uVar10 == uVar20,
               (digits_t)properties->minimumExponentDigits,(uint)properties->exponentSignAlwaysShown
              );
    (pMVar6->notation).fUnion.scientific.fExponentSignDisplay = UStack_2a0;
    *(anon_union_8_2_136a0349_for_fUnion *)&pMVar6->notation = local_2a8;
    if ((pMVar6->precision).fType == RND_FRACTION) {
      iVar7 = properties->maximumFractionDigits;
      iVar19 = properties->minimumIntegerDigits;
      if (iVar19 == 0 && iVar7 == 0) {
        Precision::unlimited();
        Precision::withMode(&local_238,roundingMode);
      }
      else if (iVar19 == 0 && properties->minimumFractionDigits == 0) {
        Precision::constructSignificant(1,iVar7 + 1);
        Precision::withMode(&local_238,roundingMode);
      }
      else {
        iVar18 = 1;
        if (iVar19 < 1) {
          iVar18 = iVar19;
        }
        if (properties->maximumIntegerDigits <= iVar19) {
          iVar18 = iVar19;
        }
        Precision::constructSignificant(iVar18 + properties->minimumFractionDigits,iVar7 + iVar19);
        Precision::withMode(&local_238,roundingMode);
      }
      FVar4.fMinSig = (undefined2)uStack_29c;
      FVar4.fMaxSig = uStack_29c._2_2_;
      FVar4.fMinFrac = (undefined2)UStack_2a0;
      FVar4.fMaxFrac = UStack_2a0._2_2_;
      *(ulong *)((long)&(pMVar6->precision).fUnion.increment.fIncrement + 4) =
           CONCAT26(uStack_296,CONCAT24(local_298,uStack_29c));
      *(undefined8 *)((long)&(pMVar6->precision).fUnion + 0xc) = uStack_294;
      *(anon_union_8_2_136a0349_for_fUnion *)&pMVar6->precision = local_2a8;
      (pMVar6->precision).fUnion.fracSig = FVar4;
    }
  }
  if ((properties->compactStyle).fNull == false) {
    if ((properties->compactStyle).fValue == UNUM_LONG) {
      NVar27 = Notation::compactLong();
    }
    else {
      NVar27 = Notation::compactShort();
    }
    pMVar6->notation = NVar27;
    pMVar6->affixProvider = (AffixPatternProvider *)0x0;
  }
  iVar7 = properties->multiplier;
  iVar19 = properties->multiplierScale + properties->magnitudeMultiplier;
  if (iVar7 == 1 || iVar19 == 0) {
    if (iVar19 == 0) {
      if (iVar7 == 1) {
        Scale::none();
      }
      else {
        Scale::byDouble((Scale *)&local_2a8.minMaxInt,(double)iVar7);
      }
    }
    else {
      Scale::powerOfTen(iVar19);
    }
  }
  else {
    Scale::byDoubleAndPowerOfTen((Scale *)&local_2a8.minMaxInt,(double)iVar7,iVar19);
  }
  Scale::operator=(&pMVar6->scale,(Scale *)&local_2a8.minMaxInt);
  Scale::~Scale((Scale *)&local_2a8.minMaxInt);
  if (exportedProperties != (DecimalFormatProperties *)0x0) {
    NullableValue<icu_63::CurrencyUnit>::operator=(&exportedProperties->currency,&currency);
    (exportedProperties->roundingMode).fValue = roundingMode;
    (exportedProperties->roundingMode).fNull = false;
    uVar10 = 0x7fffffff;
    if (uVar14 != 0xffffffff) {
      uVar10 = uVar14;
    }
    exportedProperties->minimumIntegerDigits = uVar20;
    exportedProperties->maximumIntegerDigits = uVar10;
    if (precision.fType == RND_CURRENCY) {
      Precision::withCurrency((Precision *)&local_2a8.minMaxInt,&precision,&currency,local_278);
      dVar13 = (double)CONCAT44(uStack_29c,UStack_2a0);
      uVar22 = local_2a8.errorCode;
    }
    else {
      dVar13 = (double)CONCAT44(precision.fUnion._4_4_,precision.fUnion.currencyUsage);
      uVar22 = precision.fType;
      local_298 = precision.fUnion.increment.fMinFrac;
    }
    if (uVar22 == RND_INCREMENT) {
      local_2b0 = (uint)local_298;
      uVar10 = local_2b0;
    }
    else {
      uVar10 = local_288._0_4_;
      if (uVar22 == RND_SIGNIFICANT) {
        uVar21 = (int)((ulong)dVar13 >> 0x10) >> 0x10;
        uVar11 = (uint)(short)((ulong)dVar13 >> 0x30);
      }
      else if (uVar22 == RND_FRACTION) {
        local_2b0 = SUB84(dVar13,0) >> 0x10;
        uVar10 = (int)SUB82(dVar13,0);
      }
      dVar13 = 0.0;
    }
    exportedProperties->minimumFractionDigits = uVar10;
    exportedProperties->maximumFractionDigits = local_2b0;
    exportedProperties->minimumSignificantDigits = uVar21;
    exportedProperties->maximumSignificantDigits = uVar11;
    exportedProperties->roundingIncrement = dVar13;
  }
  CurrencyUnit::~CurrencyUnit(&currency);
  Locale::~Locale(&locale);
  return pMVar6;
}

Assistant:

MacroProps NumberPropertyMapper::oldToNew(const DecimalFormatProperties& properties,
                                          const DecimalFormatSymbols& symbols,
                                          DecimalFormatWarehouse& warehouse,
                                          DecimalFormatProperties* exportedProperties,
                                          UErrorCode& status) {
    MacroProps macros;
    Locale locale = symbols.getLocale();

    /////////////
    // SYMBOLS //
    /////////////

    macros.symbols.setTo(symbols);

    //////////////////
    // PLURAL RULES //
    //////////////////

    if (!properties.currencyPluralInfo.fPtr.isNull()) {
        macros.rules = properties.currencyPluralInfo.fPtr->getPluralRules();
    }

    /////////////
    // AFFIXES //
    /////////////

    AffixPatternProvider* affixProvider;
    if (properties.currencyPluralInfo.fPtr.isNull()) {
        warehouse.currencyPluralInfoAPP.setToBogus();
        warehouse.propertiesAPP.setTo(properties, status);
        affixProvider = &warehouse.propertiesAPP;
    } else {
        warehouse.currencyPluralInfoAPP.setTo(*properties.currencyPluralInfo.fPtr, properties, status);
        warehouse.propertiesAPP.setToBogus();
        affixProvider = &warehouse.currencyPluralInfoAPP;
    }
    macros.affixProvider = affixProvider;

    ///////////
    // UNITS //
    ///////////

    bool useCurrency = (
            !properties.currency.isNull() || !properties.currencyPluralInfo.fPtr.isNull() ||
            !properties.currencyUsage.isNull() || affixProvider->hasCurrencySign());
    CurrencyUnit currency = resolveCurrency(properties, locale, status);
    UCurrencyUsage currencyUsage = properties.currencyUsage.getOrDefault(UCURR_USAGE_STANDARD);
    if (useCurrency) {
        // NOTE: Slicing is OK.
        macros.unit = currency; // NOLINT
    }
    warehouse.currencySymbols = {currency, locale, symbols, status};
    macros.currencySymbols = &warehouse.currencySymbols;

    ///////////////////////
    // ROUNDING STRATEGY //
    ///////////////////////

    int32_t maxInt = properties.maximumIntegerDigits;
    int32_t minInt = properties.minimumIntegerDigits;
    int32_t maxFrac = properties.maximumFractionDigits;
    int32_t minFrac = properties.minimumFractionDigits;
    int32_t minSig = properties.minimumSignificantDigits;
    int32_t maxSig = properties.maximumSignificantDigits;
    double roundingIncrement = properties.roundingIncrement;
    RoundingMode roundingMode = properties.roundingMode.getOrDefault(UNUM_ROUND_HALFEVEN);
    bool explicitMinMaxFrac = minFrac != -1 || maxFrac != -1;
    bool explicitMinMaxSig = minSig != -1 || maxSig != -1;
    // Resolve min/max frac for currencies, required for the validation logic and for when minFrac or
    // maxFrac was
    // set (but not both) on a currency instance.
    // NOTE: Increments are handled in "Precision.constructCurrency()".
    if (useCurrency && (minFrac == -1 || maxFrac == -1)) {
        int32_t digits = ucurr_getDefaultFractionDigitsForUsage(
                currency.getISOCurrency(), currencyUsage, &status);
        if (minFrac == -1 && maxFrac == -1) {
            minFrac = digits;
            maxFrac = digits;
        } else if (minFrac == -1) {
            minFrac = std::min(maxFrac, digits);
        } else /* if (maxFrac == -1) */ {
            maxFrac = std::max(minFrac, digits);
        }
    }
    // Validate min/max int/frac.
    // For backwards compatibility, minimum overrides maximum if the two conflict.
    // The following logic ensures that there is always a minimum of at least one digit.
    if (minInt == 0 && maxFrac != 0) {
        // Force a digit after the decimal point.
        minFrac = minFrac <= 0 ? 1 : minFrac;
        maxFrac = maxFrac < 0 ? -1 : maxFrac < minFrac ? minFrac : maxFrac;
        minInt = 0;
        maxInt = maxInt < 0 ? -1 : maxInt > kMaxIntFracSig ? -1 : maxInt;
    } else {
        // Force a digit before the decimal point.
        minFrac = minFrac < 0 ? 0 : minFrac;
        maxFrac = maxFrac < 0 ? -1 : maxFrac < minFrac ? minFrac : maxFrac;
        minInt = minInt <= 0 ? 1 : minInt > kMaxIntFracSig ? 1 : minInt;
        maxInt = maxInt < 0 ? -1 : maxInt < minInt ? minInt : maxInt > kMaxIntFracSig ? -1 : maxInt;
    }
    Precision precision;
    if (!properties.currencyUsage.isNull()) {
        precision = Precision::constructCurrency(currencyUsage).withCurrency(currency);
    } else if (roundingIncrement != 0.0) {
        precision = Precision::constructIncrement(roundingIncrement, minFrac);
    } else if (explicitMinMaxSig) {
        minSig = minSig < 1 ? 1 : minSig > kMaxIntFracSig ? kMaxIntFracSig : minSig;
        maxSig = maxSig < 0 ? kMaxIntFracSig : maxSig < minSig ? minSig : maxSig > kMaxIntFracSig
                                                                          ? kMaxIntFracSig : maxSig;
        precision = Precision::constructSignificant(minSig, maxSig);
    } else if (explicitMinMaxFrac) {
        precision = Precision::constructFraction(minFrac, maxFrac);
    } else if (useCurrency) {
        precision = Precision::constructCurrency(currencyUsage);
    }
    if (!precision.isBogus()) {
        precision = precision.withMode(roundingMode);
        macros.precision = precision;
    }

    ///////////////////
    // INTEGER WIDTH //
    ///////////////////

    macros.integerWidth = IntegerWidth(
            static_cast<digits_t>(minInt),
            static_cast<digits_t>(maxInt),
            properties.formatFailIfMoreThanMaxDigits);

    ///////////////////////
    // GROUPING STRATEGY //
    ///////////////////////

    macros.grouper = Grouper::forProperties(properties);

    /////////////
    // PADDING //
    /////////////

    if (properties.formatWidth != -1) {
        macros.padder = Padder::forProperties(properties);
    }

    ///////////////////////////////
    // DECIMAL MARK ALWAYS SHOWN //
    ///////////////////////////////

    macros.decimal = properties.decimalSeparatorAlwaysShown ? UNUM_DECIMAL_SEPARATOR_ALWAYS
                                                            : UNUM_DECIMAL_SEPARATOR_AUTO;

    ///////////////////////
    // SIGN ALWAYS SHOWN //
    ///////////////////////

    macros.sign = properties.signAlwaysShown ? UNUM_SIGN_ALWAYS : UNUM_SIGN_AUTO;

    /////////////////////////
    // SCIENTIFIC NOTATION //
    /////////////////////////

    if (properties.minimumExponentDigits != -1) {
        // Scientific notation is required.
        // This whole section feels like a hack, but it is needed for regression tests.
        // The mapping from property bag to scientific notation is nontrivial due to LDML rules.
        if (maxInt > 8) {
            // But #13110: The maximum of 8 digits has unknown origins and is not in the spec.
            // If maxInt is greater than 8, it is set to minInt, even if minInt is greater than 8.
            maxInt = minInt;
            macros.integerWidth = IntegerWidth::zeroFillTo(minInt).truncateAt(maxInt);
        } else if (maxInt > minInt && minInt > 1) {
            // Bug #13289: if maxInt > minInt > 1, then minInt should be 1.
            minInt = 1;
            macros.integerWidth = IntegerWidth::zeroFillTo(minInt).truncateAt(maxInt);
        }
        int engineering = maxInt < 0 ? -1 : maxInt;
        macros.notation = ScientificNotation(
                // Engineering interval:
                static_cast<int8_t>(engineering),
                // Enforce minimum integer digits (for patterns like "000.00E0"):
                (engineering == minInt),
                // Minimum exponent digits:
                static_cast<digits_t>(properties.minimumExponentDigits),
                // Exponent sign always shown:
                properties.exponentSignAlwaysShown ? UNUM_SIGN_ALWAYS : UNUM_SIGN_AUTO);
        // Scientific notation also involves overriding the rounding mode.
        // TODO: Overriding here is a bit of a hack. Should this logic go earlier?
        if (macros.precision.fType == Precision::PrecisionType::RND_FRACTION) {
            // For the purposes of rounding, get the original min/max int/frac, since the local
            // variables have been manipulated for display purposes.
            int maxInt_ = properties.maximumIntegerDigits;
            int minInt_ = properties.minimumIntegerDigits;
            int minFrac_ = properties.minimumFractionDigits;
            int maxFrac_ = properties.maximumFractionDigits;
            if (minInt_ == 0 && maxFrac_ == 0) {
                // Patterns like "#E0" and "##E0", which mean no rounding!
                macros.precision = Precision::unlimited().withMode(roundingMode);
            } else if (minInt_ == 0 && minFrac_ == 0) {
                // Patterns like "#.##E0" (no zeros in the mantissa), which mean round to maxFrac+1
                macros.precision = Precision::constructSignificant(1, maxFrac_ + 1).withMode(roundingMode);
            } else {
                int maxSig_ = minInt_ + maxFrac_;
                // Bug #20058: if maxInt_ > minInt_ > 1, then minInt_ should be 1.
                if (maxInt_ > minInt_ && minInt_ > 1) {
                    minInt_ = 1;
                }
                int minSig_ = minInt_ + minFrac_;
                // To avoid regression, maxSig is not reset when minInt_ set to 1.
                // TODO: Reset maxSig_ = 1 + minFrac_ to follow the spec.
                macros.precision = Precision::constructSignificant(minSig_, maxSig_).withMode(roundingMode);
            }
        }
    }

    //////////////////////
    // COMPACT NOTATION //
    //////////////////////

    if (!properties.compactStyle.isNull()) {
        if (properties.compactStyle.getNoError() == UNumberCompactStyle::UNUM_LONG) {
            macros.notation = Notation::compactLong();
        } else {
            macros.notation = Notation::compactShort();
        }
        // Do not forward the affix provider.
        macros.affixProvider = nullptr;
    }

    /////////////////
    // MULTIPLIERS //
    /////////////////

    macros.scale = scaleFromProperties(properties);

    //////////////////////
    // PROPERTY EXPORTS //
    //////////////////////

    if (exportedProperties != nullptr) {

        exportedProperties->currency = currency;
        exportedProperties->roundingMode = roundingMode;
        exportedProperties->minimumIntegerDigits = minInt;
        exportedProperties->maximumIntegerDigits = maxInt == -1 ? INT32_MAX : maxInt;

        Precision rounding_;
        if (precision.fType == Precision::PrecisionType::RND_CURRENCY) {
            rounding_ = precision.withCurrency(currency, status);
        } else {
            rounding_ = precision;
        }
        int minFrac_ = minFrac;
        int maxFrac_ = maxFrac;
        int minSig_ = minSig;
        int maxSig_ = maxSig;
        double increment_ = 0.0;
        if (rounding_.fType == Precision::PrecisionType::RND_FRACTION) {
            minFrac_ = rounding_.fUnion.fracSig.fMinFrac;
            maxFrac_ = rounding_.fUnion.fracSig.fMaxFrac;
        } else if (rounding_.fType == Precision::PrecisionType::RND_INCREMENT) {
            increment_ = rounding_.fUnion.increment.fIncrement;
            minFrac_ = rounding_.fUnion.increment.fMinFrac;
            maxFrac_ = rounding_.fUnion.increment.fMinFrac;
        } else if (rounding_.fType == Precision::PrecisionType::RND_SIGNIFICANT) {
            minSig_ = rounding_.fUnion.fracSig.fMinSig;
            maxSig_ = rounding_.fUnion.fracSig.fMaxSig;
        }

        exportedProperties->minimumFractionDigits = minFrac_;
        exportedProperties->maximumFractionDigits = maxFrac_;
        exportedProperties->minimumSignificantDigits = minSig_;
        exportedProperties->maximumSignificantDigits = maxSig_;
        exportedProperties->roundingIncrement = increment_;
    }

    return macros;
}